

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InstanceArraySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::ConstantRange&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          span<const_slang::ast::Symbol_*,_18446744073709551615UL> *args_3,ConstantRange *args_4)

{
  string_view name;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> elements;
  Compilation *compilation;
  size_t *in_RCX;
  undefined8 *in_RDX;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *in_RSI;
  __extent_storage<18446744073709551615UL> in_R8;
  pointer in_R9;
  span<const_slang::ast::Symbol_*,_18446744073709551615UL> *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  ConstantRange in_stack_ffffffffffffffa8;
  SourceLocation in_stack_ffffffffffffffb0;
  size_t sVar1;
  char *pcVar2;
  
  compilation = (Compilation *)
                allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                         (size_t)in_stack_ffffffffffffff88);
  pcVar2 = (char *)*in_RDX;
  sVar1 = *in_RCX;
  std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::Symbol_*,_18446744073709551615UL>(in_RSI,in_stack_ffffffffffffff88);
  name._M_str = pcVar2;
  name._M_len = sVar1;
  elements._M_extent._M_extent_value = in_R8._M_extent_value;
  elements._M_ptr = in_R9;
  ast::InstanceArraySymbol::InstanceArraySymbol
            ((InstanceArraySymbol *)*in_R9,compilation,name,in_stack_ffffffffffffffb0,elements,
             in_stack_ffffffffffffffa8);
  return (InstanceArraySymbol *)compilation;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }